

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O2

void remove_module(MIR_context_t ctx,MIR_module_t_conflict module,int free_module_p)

{
  MIR_item_t_conflict elem;
  undefined8 *puVar1;
  void *pvVar2;
  MIR_func_t pMVar3;
  
  do {
    elem = (module->items).head;
    if (elem == (MIR_item_t_conflict)0x0) {
      pvVar2 = module->data;
      if (pvVar2 != (void *)0x0) {
        if (*(void **)((long)pvVar2 + 0x10) == (void *)0x0) {
          mir_varr_assert_fail("destroy","bitmap_el_t");
        }
        free(*(void **)((long)pvVar2 + 0x10));
        free(pvVar2);
      }
      if (free_module_p == 0) {
        return;
      }
      free(module);
      return;
    }
    DLIST_MIR_item_t_remove(&module->items,elem);
    switch(elem->item_type) {
    case MIR_func_item:
      remove_func_insns(ctx,elem,&((elem->u).func)->insns);
      remove_func_insns(ctx,elem,&((elem->u).func)->original_insns);
      VARR_MIR_var_tdestroy(&((elem->u).func)->vars);
      pMVar3 = (elem->u).func;
      if (pMVar3->global_vars != (VARR_MIR_var_t *)0x0) {
        VARR_MIR_var_tdestroy(&pMVar3->global_vars);
        pMVar3 = (elem->u).func;
      }
      puVar1 = (undefined8 *)pMVar3->internal;
      pvVar2 = (void *)*puVar1;
      if ((pvVar2 == (void *)0x0) || (*(void **)((long)pvVar2 + 0x10) == (void *)0x0)) {
        mir_varr_assert_fail("destroy","reg_desc_t");
      }
      free(*(void **)((long)pvVar2 + 0x10));
      free(pvVar2);
      *puVar1 = 0;
      HTAB_size_t_destroy((HTAB_size_t **)(puVar1 + 1));
      HTAB_size_t_destroy((HTAB_size_t **)(puVar1 + 2));
      HTAB_size_t_destroy((HTAB_size_t **)(puVar1 + 3));
      free(pMVar3->internal);
      pMVar3->internal = (void *)0x0;
      break;
    case MIR_proto_item:
      VARR_MIR_var_tdestroy(&((elem->u).proto)->args);
      break;
    case MIR_import_item:
    case MIR_export_item:
    case MIR_forward_item:
      goto switchD_0011debf_caseD_2;
    case MIR_data_item:
    case MIR_ref_data_item:
    case MIR_lref_data_item:
    case MIR_expr_data_item:
    case MIR_bss_item:
      if ((elem->addr != (void *)0x0) && (elem->section_head_p != '\0')) {
        free(elem->addr);
      }
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                    ,0x345,"void remove_item(MIR_context_t, MIR_item_t)");
    }
    free((elem->u).func);
switchD_0011debf_caseD_2:
    free(elem->data);
    free(elem);
  } while( true );
}

Assistant:

static void remove_module (MIR_context_t ctx, MIR_module_t module, int free_module_p) {
  MIR_item_t item;

  while ((item = DLIST_HEAD (MIR_item_t, module->items)) != NULL) {
    DLIST_REMOVE (MIR_item_t, module->items, item);
    remove_item (ctx, item);
  }
  if (module->data != NULL) bitmap_destroy (module->data);
  if (free_module_p) free (module);
}